

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O2

void funnelsort<8u,buffer_layout_bfs>(uchar **strings,size_t n,uchar **tmp)

{
  size_t sVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  int iVar4;
  ostream *poVar5;
  size_t depth;
  long lVar6;
  undefined8 *puVar7;
  long lVar8;
  uchar **ppuVar9;
  undefined8 *puVar10;
  fill<8U,_2U,_buffer_layout_bfs> local_471;
  DI __d;
  array<unsigned_long,_8UL> buffer_count;
  size_t local_418;
  array<Stream,_8UL> streams;
  array<unsigned_char_*,_108UL> buffers;
  
  poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"funnelsort");
  poVar5 = std::operator<<(poVar5,"(), n=");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::operator<<(poVar5,"\n");
  if (n < 0x20) {
    insertion_sort(strings,(int)n,depth);
    return;
  }
  streams._M_elems[0].n = n >> 3;
  streams._M_elems[0].stream = strings;
  lVar6 = (long)strings + (n & 0xfffffffffffffff8);
  for (lVar8 = 0x18; lVar8 != 0x78; lVar8 = lVar8 + 0x10) {
    *(long *)((long)streams._M_elems + lVar8 + -8) = lVar6;
    *(size_t *)((long)&streams._M_elems[0].stream + lVar8) = streams._M_elems[0].n;
    lVar6 = lVar6 + (n & 0xfffffffffffffff8);
  }
  streams._M_elems[7].stream = streams._M_elems[6].stream + streams._M_elems[0].n;
  streams._M_elems[7].n = streams._M_elems[0].n * -7 + n;
  local_418 = n;
  for (lVar6 = 8; lVar6 != 0x88; lVar6 = lVar6 + 0x10) {
    ppuVar9 = *(uchar ***)((long)streams._M_elems + lVar6 + -8);
    sVar1 = *(size_t *)((long)&streams._M_elems[0].stream + lVar6);
    mergesort_4way(ppuVar9,sVar1,tmp);
    check_input(ppuVar9,sVar1);
  }
  buffers._M_elems[0] = (uchar *)0x0;
  std::array<unsigned_long,_8UL>::fill(&buffer_count,(value_type_conflict *)&buffers);
  poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"fill_root");
  std::operator<<(poVar5,", root\n");
  __d.i = &__debug_indent_str_abi_cxx11_;
  std::__cxx11::string::append((char *)&__debug_indent_str_abi_cxx11_);
  ppuVar9 = tmp;
  while( true ) {
    if ((buffer_count._M_elems[2] == 0) &&
       (fill<8U,_2U,_buffer_layout_bfs>::operator()
                  (&local_471,&streams,buffers._M_elems,&buffer_count),
       buffer_count._M_elems[2] == 0)) {
      poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
      std::operator<<(poVar5,"left stream drained\n");
      if (buffer_count._M_elems[2] != 0) {
        __assert_fail("buffer_count[2] == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                      ,0x238,
                      "void fill_root(std::array<Stream, K> &__restrict, unsigned char **__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict) [K = 8U, BufferLayout = buffer_layout_bfs]"
                     );
      }
      if (buffer_count._M_elems[3] == 0) {
        __assert_fail("buffer_count[3] != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                      ,0x239,
                      "void fill_root(std::array<Stream, K> &__restrict, unsigned char **__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict) [K = 8U, BufferLayout = buffer_layout_bfs]"
                     );
      }
      while (uVar2 = buffer_count._M_elems[3], buffer_count._M_elems[3] != 0) {
        if (buffer_count._M_elems[3] * 8 != 0) {
          memcpy(ppuVar9,(void *)((long)&buffers + buffer_count._M_elems[3] * -8 + 0x80),
                 buffer_count._M_elems[3] * 8);
        }
        buffer_count._M_elems[3] = 0;
        fill<8U,_3U,_buffer_layout_bfs>::operator()
                  ((fill<8U,_3U,_buffer_layout_bfs> *)&local_471,&streams,buffers._M_elems,
                   &buffer_count);
        ppuVar9 = ppuVar9 + uVar2;
      }
      goto LAB_00122f85;
    }
    if ((buffer_count._M_elems[3] == 0) &&
       (fill<8U,_3U,_buffer_layout_bfs>::operator()
                  ((fill<8U,_3U,_buffer_layout_bfs> *)&local_471,&streams,buffers._M_elems,
                   &buffer_count), buffer_count._M_elems[3] == 0)) break;
    uVar3 = buffer_count._M_elems[3];
    uVar2 = buffer_count._M_elems[2];
    poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,"L:\'");
    puVar10 = (undefined8 *)((long)&buffers + (8 - uVar2) * 8);
    poVar5 = std::operator<<(poVar5,(char *)*puVar10);
    poVar5 = std::operator<<(poVar5,"\', R:\'");
    puVar7 = (undefined8 *)((long)&buffers + (8 - uVar3) * 8 + 0x40);
    poVar5 = std::operator<<(poVar5,(char *)*puVar7);
    std::operator<<(poVar5,"\'\n");
    iVar4 = cmp((void *)*puVar10,(void *)*puVar7);
    if (iVar4 < 1) {
      puVar7 = puVar10;
    }
    buffer_count._M_elems[(ulong)(0 < iVar4) + 2] =
         buffer_count._M_elems[(ulong)(0 < iVar4) + 2] - 1;
    *ppuVar9 = (uchar *)*puVar7;
    ppuVar9 = ppuVar9 + 1;
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  std::operator<<(poVar5,"right stream drained\n");
  if (buffer_count._M_elems[2] == 0) {
    __assert_fail("buffer_count[2] != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                  ,0x247,
                  "void fill_root(std::array<Stream, K> &__restrict, unsigned char **__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict) [K = 8U, BufferLayout = buffer_layout_bfs]"
                 );
  }
  if (buffer_count._M_elems[3] != 0) {
    __assert_fail("buffer_count[3] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                  ,0x248,
                  "void fill_root(std::array<Stream, K> &__restrict, unsigned char **__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict) [K = 8U, BufferLayout = buffer_layout_bfs]"
                 );
  }
  while (uVar2 = buffer_count._M_elems[2], buffer_count._M_elems[2] != 0) {
    memcpy(ppuVar9,(void *)((long)&buffers + buffer_count._M_elems[2] * -8 + 0x40),
           buffer_count._M_elems[2] * 8);
    buffer_count._M_elems[2] = 0;
    fill<8U,_2U,_buffer_layout_bfs>::operator()(&local_471,&streams,buffers._M_elems,&buffer_count);
    ppuVar9 = ppuVar9 + uVar2;
  }
LAB_00122f85:
  anon_func::DI::~DI(&__d);
  sVar1 = local_418;
  memcpy(strings,tmp,local_418 * 8);
  check_input(strings,sVar1);
  return;
}

Assistant:

static void
funnelsort(unsigned char** strings, size_t n, unsigned char** restrict tmp)
{
	debug() << __func__ << "(), n=" << n << "\n";
	if (n < 32) {
		insertion_sort(strings, n, 0);
		return;
	}
	size_t splitter = n/K;
	std::array<Stream, K> streams;
	streams[0].stream = strings;
	streams[0].n      = splitter;
	for (unsigned i=1; i < K-1; ++i) {
		streams[i].stream = streams[i-1].stream + splitter;
		streams[i].n = splitter;
	}
	streams[K-1].stream = streams[K-2].stream + splitter;
	streams[K-1].n      = n - (K-1)*splitter;
	for (unsigned i=0; i < K; ++i) {
		funnelsort<(K>16?K/4:K/2),BufferLayout>(streams[i].stream,
		                                        streams[i].n, tmp);
		check_input(streams[i].stream, streams[i].n);
	}
	std::array<unsigned char*, buffer_total_size<K>::value> buffers;
	std::array<size_t, K> buffer_count;
	buffer_count.fill(0);
	fill_root<K,BufferLayout>(streams,tmp,buffers.data(),buffer_count);
	(void) memcpy(strings, tmp, n*sizeof(unsigned char*));
	check_input(strings, n);
}